

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O1

void __thiscall TRM::Edge::set_top(Edge *this,Vertex *v)

{
  Vertex *pVVar1;
  Vertex *pVVar2;
  
  pVVar1 = this->top;
  if (this->below_prev == (Edge *)0x0) {
    *(Edge **)(pVVar1 + 0x28) = this->below_next;
  }
  else {
    this->below_prev->below_next = this->below_next;
  }
  pVVar2 = (Vertex *)&this->below_next->below_prev;
  if (this->below_next == (Edge *)0x0) {
    pVVar2 = pVVar1 + 0x30;
  }
  *(Edge **)pVVar2 = this->below_prev;
  this->below_prev = (Edge *)0x0;
  this->below_next = (Edge *)0x0;
  this->top = v;
  recompute(this);
  Vertex::insert_below(this->top,this);
  return;
}

Assistant:

void Edge::set_top(Vertex* v) {
  // remove this edge from top's below list
  LinkedList<Edge>::Remove<&Edge::below_prev, &Edge::below_next>(
      this, &top->edge_below.head, &top->edge_below.tail);
  // update top vertex
  top = v;
  // recompute line equation
  recompute();
  // insert self to new top's below list
  top->insert_below(this);
}